

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

void __thiscall
kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpChunkedEntityWriter>::disposeImpl
          (HeapDisposer<kj::(anonymous_namespace)::HttpChunkedEntityWriter> *this,void *pointer)

{
  HttpOutputStream *this_00;
  char *pcVar1;
  size_t sVar2;
  char (*in_RDX) [6];
  String local_28;
  
  if (pointer != (void *)0x0) {
    this_00 = *(HttpOutputStream **)((long)pointer + 8);
    if ((this_00->writeInProgress == false) && ((this_00->inBody & 1U) != 0)) {
      str<char_const(&)[6]>(&local_28,(kj *)0x388c13,in_RDX);
      anon_unknown_31::HttpOutputStream::writeBodyData(this_00,&local_28);
      sVar2 = local_28.content.size_;
      pcVar1 = local_28.content.ptr;
      if (local_28.content.ptr != (char *)0x0) {
        local_28.content.ptr = (char *)0x0;
        local_28.content.size_ = 0;
        (**(local_28.content.disposer)->_vptr_ArrayDisposer)
                  (local_28.content.disposer,pcVar1,1,sVar2,sVar2,0);
      }
      anon_unknown_31::HttpOutputStream::finishBody(*(HttpOutputStream **)((long)pointer + 8));
    }
    else {
      anon_unknown_31::HttpOutputStream::abortBody(this_00);
    }
  }
  operator_delete(pointer,0x10);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }